

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O1

void __thiscall
flatbuffers::vector_downward<unsigned_long>::reallocate
          (vector_downward<unsigned_long> *this,size_t len)

{
  ulong old_size;
  size_t in_use_back;
  Allocator *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8_t *puVar3;
  ulong uVar4;
  size_t in_use_front;
  Allocator local_28;
  
  old_size = this->reserved_;
  puVar3 = this->buf_;
  if (old_size == 0) {
    uVar4 = this->initial_size_;
  }
  else {
    uVar4 = old_size >> 1;
  }
  in_use_back = this->size_;
  in_use_front = (long)this->scratch_ - (long)puVar3;
  if (len < uVar4) {
    len = uVar4;
  }
  pAVar1 = this->allocator_;
  uVar4 = -this->buffer_minalign_ & (len + old_size + this->buffer_minalign_) - 1;
  this->reserved_ = uVar4;
  if (puVar3 == (uint8_t *)0x0) {
    if (pAVar1 == (Allocator *)0x0) {
      puVar3 = (uint8_t *)operator_new__(uVar4);
    }
    else {
      iVar2 = (*pAVar1->_vptr_Allocator[2])(pAVar1,uVar4);
      puVar3 = (uint8_t *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  else if (pAVar1 == (Allocator *)0x0) {
    local_28._vptr_Allocator = (_func_int **)&PTR__Allocator_00200ce8;
    puVar3 = Allocator::reallocate_downward
                       (&local_28,puVar3,old_size,uVar4,in_use_back,in_use_front);
  }
  else {
    iVar2 = (*pAVar1->_vptr_Allocator[4])(pAVar1);
    puVar3 = (uint8_t *)CONCAT44(extraout_var,iVar2);
  }
  this->buf_ = puVar3;
  this->cur_ = puVar3 + (this->reserved_ - in_use_back);
  this->scratch_ = puVar3 + in_use_front;
  return;
}

Assistant:

void reallocate(size_t len) {
    auto old_reserved = reserved_;
    auto old_size = size();
    auto old_scratch_size = scratch_size();
    reserved_ +=
        (std::max)(len, old_reserved ? old_reserved / 2 : initial_size_);
    reserved_ = (reserved_ + buffer_minalign_ - 1) & ~(buffer_minalign_ - 1);
    if (buf_) {
      buf_ = ReallocateDownward(allocator_, buf_, old_reserved, reserved_,
                                old_size, old_scratch_size);
    } else {
      buf_ = Allocate(allocator_, reserved_);
    }
    cur_ = buf_ + reserved_ - old_size;
    scratch_ = buf_ + old_scratch_size;
  }